

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O3

Parsekey __thiscall
free_format_parser::HMpsFF::parseCones(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  string *str;
  iterator __position;
  iterator __position_00;
  pointer pvVar1;
  iterator __position_01;
  double dVar2;
  bool bVar3;
  int iVar4;
  Parsekey PVar5;
  size_t sVar6;
  long lVar7;
  Parsekey PVar8;
  string *__return_storage_ptr__;
  _Alloc_hider this_00;
  ConeType conetype;
  bool skip;
  string conetypestr;
  HighsInt colidx;
  string strline;
  string colname;
  string coneparam;
  string conename;
  size_t begin;
  string thirdarg;
  string secondarg;
  ConeType local_140;
  bool local_139;
  HighsLogOptions *local_138;
  string local_130;
  HighsInt local_10c;
  string local_108;
  undefined1 local_e0 [32];
  char *local_c0 [2];
  char local_b0 [16];
  size_t local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  char local_88 [16];
  size_t local_78;
  string local_70;
  string local_50;
  
  str = &this->section_args;
  local_138 = log_options;
  first_word((string *)&local_98,str,0);
  sVar6 = first_word_end(str,0);
  if (local_98._8_8_ == 0) {
    PVar8 = kFail;
    highsLogUser(local_138,kError,"Cone name missing in CSECTION\n");
    goto LAB_001f8a8c;
  }
  first_word(&local_50,str,sVar6);
  sVar6 = first_word_end(str,sVar6);
  __return_storage_ptr__ = &local_70;
  first_word(__return_storage_ptr__,str,sVar6);
  local_a0 = first_word_end(str,sVar6);
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"0.0","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  if (local_70._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)local_c0);
  }
  std::__cxx11::string::_M_assign((string *)&local_130);
  if (local_130._M_string_length == 0) {
    trim(str,&default_non_chars_abi_cxx11_);
    PVar8 = kFail;
    highsLogUser(local_138,kError,"Cone type missing in CSECTION %s\n",(str->_M_dataplus)._M_p);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_130);
    if (iVar4 == 0) {
      local_140 = kZero;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_130);
      if (iVar4 == 0) {
        local_140 = kQuad;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_130);
        if (iVar4 == 0) {
          local_140 = kRQuad;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_130);
          if (iVar4 == 0) {
            local_140 = kPExp;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_130);
            if (iVar4 == 0) {
              local_140 = kPPow;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_130);
              if (iVar4 == 0) {
                local_140 = kDExp;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_130);
                if (iVar4 != 0) {
                  trim(&local_130,&default_non_chars_abi_cxx11_);
                  PVar8 = kFail;
                  highsLogUser(local_138,kError,"Unrecognized cone type %s\n",
                               local_130._M_dataplus._M_p);
                  goto LAB_001f8a3a;
                }
                local_140 = kDPow;
              }
            }
          }
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->cone_name,(value_type *)&local_98);
    __position._M_current =
         (this->cone_type).
         super__Vector_base<free_format_parser::HMpsFF::ConeType,_std::allocator<free_format_parser::HMpsFF::ConeType>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->cone_type).
        super__Vector_base<free_format_parser::HMpsFF::ConeType,_std::allocator<free_format_parser::HMpsFF::ConeType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<free_format_parser::HMpsFF::ConeType,std::allocator<free_format_parser::HMpsFF::ConeType>>
      ::_M_realloc_insert<free_format_parser::HMpsFF::ConeType_const&>
                ((vector<free_format_parser::HMpsFF::ConeType,std::allocator<free_format_parser::HMpsFF::ConeType>>
                  *)&this->cone_type,__position,&local_140);
    }
    else {
      *__position._M_current = local_140;
      (this->cone_type).
      super__Vector_base<free_format_parser::HMpsFF::ConeType,_std::allocator<free_format_parser::HMpsFF::ConeType>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    local_108._M_dataplus._M_p = (pointer)atof(local_c0[0]);
    __position_00._M_current =
         (this->cone_param).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->cone_param).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->cone_param,__position_00,(double *)&local_108);
    }
    else {
      *__position_00._M_current = (double)local_108._M_dataplus._M_p;
      (this->cone_param).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position_00._M_current + 1;
    }
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&this->cone_entries,(vector<int,_std::allocator<int>_> *)&local_108);
    this_00._M_p = local_108._M_dataplus._M_p;
    if ((HMpsFF *)local_108._M_dataplus._M_p != (HMpsFF *)0x0) {
      operator_delete(local_108._M_dataplus._M_p);
      this_00._M_p = local_108._M_dataplus._M_p;
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity =
         local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
    do {
      do {
        bVar3 = getMpsLine((HMpsFF *)this_00._M_p,file,&local_108,&local_139);
        if (!bVar3) {
          PVar8 = kFail;
          goto LAB_001f8a26;
        }
      } while (local_139 != false);
      if ((0.0 < this->time_limit_) &&
         (lVar7 = std::chrono::_V2::system_clock::now(),
         dVar2 = (double)lVar7 / 1000000000.0 - this->start_time,
         this->time_limit_ <= dVar2 && dVar2 != this->time_limit_)) {
        PVar8 = kTimeout;
        break;
      }
      local_e0._0_8_ = local_e0 + 0x10;
      local_e0._8_8_ = 0;
      local_e0[0x10] = '\0';
      PVar5 = checkFirstWord(this,&local_108,&local_78,&local_a0,(string *)local_e0);
      if (PVar5 == kNone) {
        local_10c = getColIdx(this,(string *)local_e0,true);
        pvVar1 = (this->cone_entries).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        __position_01._M_current =
             pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_01._M_current ==
            pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)(pvVar1 + -1),__position_01,&local_10c);
        }
        else {
          *__position_01._M_current = local_10c;
          pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = __position_01._M_current + 1;
        }
      }
      else {
        highsLogDev(local_138,kInfo,"readMPS: Read CSECTION OK\n");
        __return_storage_ptr__ = (string *)(ulong)PVar5;
      }
      PVar8 = (Parsekey)__return_storage_ptr__;
      this_00._M_p = (pointer)local_e0._0_8_;
      if ((HMpsFF *)local_e0._0_8_ != (HMpsFF *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_);
      }
    } while (PVar5 == kNone);
LAB_001f8a26:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
LAB_001f8a3a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
LAB_001f8a8c:
  if ((char *)local_98._M_allocated_capacity != local_88) {
    operator_delete((void *)local_98._M_allocated_capacity);
  }
  return PVar8;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseCones(const HighsLogOptions& log_options,
                                             std::istream& file) {
  size_t end = 0;

  // first argument should be cone name
  std::string conename = first_word(section_args, end);
  end = first_word_end(section_args, end);

  if (conename.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Cone name missing in CSECTION\n");
    return HMpsFF::Parsekey::kFail;
  }

  // second argument is cone parameter, but is optional
  // third argument is cone type
  std::string secondarg = first_word(section_args, end);
  end = first_word_end(section_args, end);

  std::string thirdarg = first_word(section_args, end);
  end = first_word_end(section_args, end);

  std::string coneparam = "0.0";
  std::string conetypestr;
  if (thirdarg.empty()) {
    conetypestr = secondarg;
  } else {
    coneparam = secondarg;
    conetypestr = thirdarg;
  }

  if (conetypestr.empty()) {
    trim(section_args);
    highsLogUser(log_options, HighsLogType::kError,
                 "Cone type missing in CSECTION %s\n", section_args.c_str());
    return HMpsFF::Parsekey::kFail;
  }

  ConeType conetype;
  if (conetypestr == "ZERO")
    conetype = ConeType::kZero;
  else if (conetypestr == "QUAD")
    conetype = ConeType::kQuad;
  else if (conetypestr == "RQUAD")
    conetype = ConeType::kRQuad;
  else if (conetypestr == "PEXP")
    conetype = ConeType::kPExp;
  else if (conetypestr == "PPOW")
    conetype = ConeType::kPPow;
  else if (conetypestr == "DEXP")
    conetype = ConeType::kDExp;
  else if (conetypestr == "DPOW")
    conetype = ConeType::kDPow;
  else {
    trim(conetypestr);
    highsLogUser(log_options, HighsLogType::kError,
                 "Unrecognized cone type %s\n", conetypestr.c_str());
    return HMpsFF::Parsekey::kFail;
  }

  cone_name.push_back(conename);
  cone_type.push_back(conetype);
  cone_param.push_back(atof(coneparam.c_str()));
  cone_entries.push_back(std::vector<HighsInt>());

  // now parse the cone entries: one column per line
  std::string strline;
  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin;
    std::string colname;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, colname);

    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read CSECTION OK\n");
      return key;
    }

    // colname -> colidx
    HighsInt colidx = getColIdx(colname);
    assert(colidx >= 0);
    assert(colidx < num_col);

    cone_entries.back().push_back(colidx);
  }

  return HMpsFF::Parsekey::kFail;
}